

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_addclause(sat_solver *s,lit *begin,lit *end)

{
  uint uVar1;
  uint *pBeg;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  char *pcVar6;
  uint *puVar7;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar7 = (uint *)begin;
  if (s->fPrintClause != 0) {
    for (; puVar7 < end; puVar7 = puVar7 + 1) {
      pcVar6 = "!";
      if ((*puVar7 & 1) == 0) {
        pcVar6 = "";
      }
      printf("%s%d ",pcVar6,(ulong)(uint)((int)*puVar7 >> 1));
    }
    putchar(10);
  }
  veci_resize(&s->temp_clause,0);
  for (; begin < end; begin = begin + 1) {
    veci_push(&s->temp_clause,*begin);
  }
  pBeg = (uint *)(s->temp_clause).ptr;
  puVar7 = pBeg + (s->temp_clause).size;
  iVar5 = (int)*pBeg >> 1;
  puVar2 = pBeg;
  while (puVar2 = puVar2 + 1, puVar2 < puVar7) {
    uVar3 = *puVar2;
    puVar4 = puVar2;
    if (iVar5 < (int)uVar3 >> 1) {
      iVar5 = (int)uVar3 >> 1;
    }
    for (; (pBeg < puVar4 && ((int)uVar3 < (int)puVar4[-1])); puVar4 = puVar4 + -1) {
      *puVar4 = puVar4[-1];
    }
    *puVar4 = uVar3;
  }
  sat_solver_setnvars(s,iVar5 + 1);
  if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
     (iVar5 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)pBeg,(lit *)puVar7), iVar5 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  uVar3 = 0xfffffffe;
  iVar5 = 1;
  puVar2 = pBeg;
  puVar4 = pBeg;
  while( true ) {
    if (puVar7 <= puVar2) {
      if (puVar4 == pBeg) {
        iVar5 = 0;
      }
      else {
        if ((long)puVar4 - (long)pBeg == 4) {
          iVar5 = sat_solver_enqueue(s,*pBeg,0);
          return iVar5;
        }
        sat_solver_clause_new(s,(lit *)pBeg,(lit *)puVar4,0);
      }
      return iVar5;
    }
    uVar1 = *puVar2;
    if ((uVar1 ^ uVar3) == 1) {
      return 1;
    }
    if ((uVar1 & 1) == (int)s->assigns[(int)uVar1 >> 1]) break;
    if (s->assigns[(int)uVar1 >> 1] == '\x03' && uVar1 != uVar3) {
      *puVar4 = uVar1;
      puVar4 = puVar4 + 1;
      uVar3 = uVar1;
    }
    puVar2 = puVar2 + 1;
  }
  return 1;
}

Assistant:

int sat_solver_addclause(sat_solver* s, lit* begin, lit* end)
{
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( s->fPrintClause )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver_setnvars(s,maxvar+1);

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver_enqueue(s,*begin,0);

    // create new clause
    sat_solver_clause_new(s,begin,j,0);
    return true;
}